

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode ExpandedNodeId_decodeBinary(UA_ExpandedNodeId *dst,UA_DataType *_)

{
  byte bVar1;
  UA_StatusCode UVar2;
  uint local_28;
  UA_StatusCode retval;
  UA_Byte encoding;
  UA_DataType *__local;
  UA_ExpandedNodeId *dst_local;
  
  if (pos < end) {
    bVar1 = *pos;
    *pos = bVar1 & 0x3f;
    local_28 = NodeId_decodeBinary(&dst->nodeId,(UA_DataType *)0x0);
    if ((bVar1 & 0x80) != 0) {
      (dst->nodeId).namespaceIndex = 0;
      UVar2 = String_decodeBinary(&dst->namespaceUri,(UA_DataType *)0x0);
      local_28 = UVar2 | local_28;
    }
    if ((bVar1 & 0x40) != 0) {
      UVar2 = UInt32_decodeBinary(&dst->serverIndex,(UA_DataType *)0x0);
      local_28 = UVar2 | local_28;
    }
    dst_local._4_4_ = local_28;
  }
  else {
    dst_local._4_4_ = 0x80070000;
  }
  return dst_local._4_4_;
}

Assistant:

static UA_StatusCode
ExpandedNodeId_decodeBinary(UA_ExpandedNodeId *dst, const UA_DataType *_) {
    /* Decode the encoding mask */
    if(pos >= end)
        return UA_STATUSCODE_BADDECODINGERROR;
    UA_Byte encoding = *pos;

    /* Mask out the encoding byte on the stream to decode the NodeId only */
    *pos = encoding & (UA_Byte)~(UA_EXPANDEDNODEID_NAMESPACEURI_FLAG |
                                 UA_EXPANDEDNODEID_SERVERINDEX_FLAG);
    UA_StatusCode retval = NodeId_decodeBinary(&dst->nodeId, NULL);

    /* Decode the NamespaceUri */
    if(encoding & UA_EXPANDEDNODEID_NAMESPACEURI_FLAG) {
        dst->nodeId.namespaceIndex = 0;
        retval |= String_decodeBinary(&dst->namespaceUri, NULL);
    }

    /* Decode the ServerIndex */
    if(encoding & UA_EXPANDEDNODEID_SERVERINDEX_FLAG)
        retval |= UInt32_decodeBinary(&dst->serverIndex, NULL);
    return retval;
}